

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  bool bVar1;
  CppType CVar2;
  RepeatedField<int> *pRVar3;
  LogMessage *pLVar4;
  LogFinisher local_192;
  byte local_191;
  LogMessage local_190;
  LogFinisher local_152;
  byte local_151;
  LogMessage local_150;
  LogFinisher local_112;
  byte local_111;
  LogMessage local_110;
  LogFinisher local_d5 [20];
  byte local_c1;
  LogMessage local_c0;
  Extension *local_88;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  byte local_6e;
  FieldType local_6d;
  int value_local;
  bool packed_local;
  FieldType type_local;
  ExtensionSet *pEStack_68;
  int number_local;
  ExtensionSet *this_local;
  Arena *local_50;
  RepeatedField<int> *local_48;
  Arena *local_40;
  Rep *local_38;
  Arena *local_30;
  RepeatedField<int> *local_28;
  RepeatedField<int> *t;
  byte local_11;
  Arena *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local._4_4_ = value;
  local_6e = packed;
  local_6d = type;
  value_local = number;
  pEStack_68 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_88);
  if (bVar1) {
    local_88->type = local_6d;
    CVar2 = anon_unknown_29::cpp_type(local_88->type);
    local_c1 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1d4);
      local_c1 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_c0,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(local_d5,pLVar4);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
    local_88->is_repeated = true;
    local_88->is_packed = (bool)(local_6e & 1);
    this_00 = this->arena_;
    local_50 = this_00;
    if (this_00 == (Arena *)0x0) {
      pRVar3 = (RepeatedField<int> *)operator_new(0x10);
      RepeatedField<int>::RepeatedField(pRVar3);
      local_48 = pRVar3;
    }
    else {
      local_38 = (Rep *)0x0;
      local_30 = this_00;
      local_11 = Arena::SkipDeleteList<google::protobuf::RepeatedField<int>>(0);
      t = (RepeatedField<int> *)&local_40;
      local_40 = this_00;
      local_10 = this_00;
      pRVar3 = (RepeatedField<int> *)
               Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      RepeatedField<int>::RepeatedField(pRVar3,*(Arena **)t);
      local_28 = pRVar3;
      if ((local_11 & 1) == 0) {
        Arena::AddListNode(this_00,pRVar3,
                           arena_destruct_object<google::protobuf::RepeatedField<int>>);
      }
      local_48 = local_28;
    }
    (local_88->field_0).repeated_int32_value = local_48;
  }
  else {
    local_111 = 0;
    if ((local_88->is_repeated & 1U) == 0) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1da);
      local_111 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_110,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_112,pLVar4);
    }
    if ((local_111 & 1) != 0) {
      LogMessage::~LogMessage(&local_110);
    }
    CVar2 = anon_unknown_29::cpp_type(local_88->type);
    local_151 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_150,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1da);
      local_151 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_150,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_152,pLVar4);
    }
    if ((local_151 & 1) != 0) {
      LogMessage::~LogMessage(&local_150);
    }
    local_191 = 0;
    if ((local_88->is_packed & 1U) != (local_6e & 1)) {
      LogMessage::LogMessage
                (&local_190,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1db);
      local_191 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_190,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_192,pLVar4);
    }
    if ((local_191 & 1) != 0) {
      LogMessage::~LogMessage(&local_190);
    }
  }
  RepeatedField<int>::Add
            ((local_88->field_0).repeated_int32_value,(int *)((long)&descriptor_local + 4));
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type,
                           bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}